

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb-compat-util.h
# Opt level: O0

char * mmdb_strdup(char *str)

{
  size_t sVar1;
  char *copy;
  size_t len;
  char *str_local;
  
  sVar1 = strlen(str);
  str_local = (char *)malloc(sVar1 + 1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(str_local,str,sVar1 + 1);
  }
  return str_local;
}

Assistant:

static char *mmdb_strdup(const char *str) {
    size_t len;
    char *copy;

    len = strlen(str) + 1;
    if ((copy = malloc(len)) == NULL)
        return (NULL);
    memcpy(copy, str, len);
    return (copy);
}